

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O1

int trim_finfo(FINFO **fp)

{
  finfo *pfVar1;
  finfo *pfVar2;
  int iVar3;
  finfo **ppfVar4;
  size_t sVar5;
  finfo *pfVar6;
  FINFO *pFVar7;
  int iVar8;
  FINFO *pFVar9;
  finfo *pfVar10;
  int iVar11;
  FINFO *pFVar12;
  finfo *pfVar13;
  char ver [16];
  char local_48 [24];
  
  pFVar12 = *fp;
  pFVar9 = (FINFO *)0x0;
  iVar11 = 0;
  iVar8 = 0;
  do {
    if (pFVar12->dirp == 0) {
      pfVar6 = pFVar12->next;
      pfVar10 = pFVar12;
      pfVar13 = pFVar12;
      if (pfVar6 != (finfo *)0x0) {
        iVar3 = strcmp(pfVar6->no_ver_name,pFVar12->no_ver_name);
        pfVar1 = pfVar6;
        while (pfVar2 = pfVar1, iVar3 == 0) {
          iVar11 = iVar11 + 1;
          pfVar1 = pfVar2->next;
          pfVar10 = pfVar6;
          pfVar13 = pfVar2;
          if (pfVar1 == (finfo *)0x0) break;
          iVar3 = strcmp(pfVar1->no_ver_name,pfVar2->no_ver_name);
        }
      }
      if (pFVar12->version == 0) {
        if (pfVar13 == pFVar12) {
          sVar5 = strlen(pfVar13->lname);
          (pfVar13->lname + sVar5)[0] = ';';
          (pfVar13->lname + sVar5)[1] = '1';
          pfVar13->lname[sVar5 + 2] = '\0';
          pfVar13->lname_len = pfVar13->lname_len + 2;
          iVar11 = iVar8 + 1;
          pFVar9 = pfVar13;
          iVar8 = iVar11;
        }
        else {
          pfVar6 = pFVar12;
          do {
            pfVar6 = pfVar6->next;
            if (pfVar13 == pfVar6) break;
          } while (pfVar6->ino != pFVar12->ino);
          if (pfVar6->ino != pFVar12->ino) {
            sprintf(local_48,";%u",(ulong)(pfVar10->version + 1));
            strcat(pFVar12->lname,local_48);
            sVar5 = strlen(pFVar12->lname);
            pFVar12->lname_len = sVar5;
            goto LAB_00118af5;
          }
          pFVar12->next = (finfo *)0x0;
          pfVar6 = pFVar12;
          do {
            pFVar7 = pfVar6;
            pfVar6 = pFVar7->next;
          } while (pfVar6 != (finfo *)0x0);
          pFVar7->next = FreeFinfoList;
          ppfVar4 = &pFVar9->next;
          if (pFVar9 == (FINFO *)0x0) {
            ppfVar4 = fp;
          }
          FreeFinfoList = pFVar12;
          *ppfVar4 = pfVar10;
          pFVar9 = pfVar13;
          iVar8 = iVar11;
        }
      }
      else {
        if (pfVar13 == pFVar12) {
          iVar11 = iVar8;
        }
LAB_00118af5:
        iVar11 = iVar11 + 1;
        pFVar9 = pfVar13;
        iVar8 = iVar11;
      }
    }
    else {
      iVar11 = iVar11 + 1;
      pFVar9 = pFVar12;
      iVar8 = iVar8 + 1;
    }
    pFVar12 = pFVar9->next;
    if (pFVar12 == (finfo *)0x0) {
      return iVar11;
    }
  } while( true );
}

Assistant:

static int trim_finfo(FINFO **fp)
{
#ifndef DOS
  FINFO *tp, *sp, *mp, *cp, *pp;
  int num, pnum;
  int linkp;
  char ver[VERSIONLEN];

  sp = mp = cp = *fp;
  pp = (FINFO *)NULL;
  num = pnum = 0;

  do {
    if (cp->dirp) {
      pp = cp;
      sp = cp = cp->next;
      pnum++;
      num++;
      continue;
    }

    if (cp->next != (FINFO *)NULL && strcmp(cp->next->no_ver_name, cp->no_ver_name) == 0) {
      mp = cp = cp->next;
      num++;
      while (cp->next != (FINFO *)NULL && strcmp(cp->next->no_ver_name, cp->no_ver_name) == 0) {
        cp = cp->next;
        num++;
      }
    } else {
      mp = cp;
    }

    if (sp->version == 0) {
      if (cp != sp) {
        /*
         * Both versionless and versioned files exists.
         */
        linkp = 0;
        tp = sp;
        do {
          tp = tp->next;
          if (tp->ino == sp->ino) {
            linkp = 1;
            break;
          }
        } while (cp != tp);

        if (!linkp) {
          /*
           * Versionless is not linked to any versioned
           * file.
           */
          sprintf(ver, ";%u", mp->version + 1);
          strcat(sp->lname, ver);
          sp->lname_len = strlen(sp->lname);
          pnum = ++num;
          pp = cp;
          sp = cp = cp->next;
        } else {
          /*
           * Versionless is linked to one of versionless
           * files. We can remove it.
           */
          sp->next = (FINFO *)NULL;
          FreeFinfo(sp);
          pnum = num;
          if (pp != (FINFO *)NULL)
            pp->next = mp;
          else
            *fp = mp;
          pp = cp;
          sp = cp = cp->next;
        }
      } else {
        /*
         * Only versionless file exists. It is regarded as
         * version 1.
         */
        strcat(cp->lname, ";1");
        cp->lname_len += 2;
        pp = cp;
        sp = cp = cp->next;
        num = ++pnum;
      }
    } else {
      if (cp != sp) {
        /*
         * All files are versioned.
         */
        pnum = ++num;
      } else {
        /*
         * A versioned file only exists.
         */
        num = ++pnum;
      }
      pp = cp;
      sp = cp = cp->next;
    }
  } while (sp != (FINFO *)NULL);

#else  /* DOS version */
  int num = 0;
  FINFO *tp;
  tp = *fp;
  while (tp) {
    num++;
    tp = tp->next;
  }
#endif /* DOS */

  return (num);
}